

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::Image::removeMask(Image *this)

{
  uint8 *puVar1;
  int32 i;
  int iVar2;
  ulong uVar3;
  int32 x;
  int iVar4;
  uint8 *puVar5;
  
  iVar2 = this->depth;
  if (iVar2 < 9) {
    for (uVar3 = 0; uVar3 < (ulong)(4L << ((byte)iVar2 & 0x3f)); uVar3 = uVar3 + 4) {
      this->palette[uVar3 + 3] = 0xff;
    }
  }
  else if (iVar2 != 0x18) {
    puVar1 = this->pixels;
    for (iVar2 = 0; iVar2 < this->height; iVar2 = iVar2 + 1) {
      puVar5 = puVar1;
      for (iVar4 = 0; iVar4 < this->width; iVar4 = iVar4 + 1) {
        if (this->depth == 0x20) {
          puVar5[3] = 0xff;
          puVar5 = puVar5 + 4;
        }
        else if (this->depth == 0x10) {
          puVar5[1] = puVar5[1] | 0x80;
          puVar5 = puVar5 + 2;
        }
      }
      puVar1 = puVar1 + this->stride;
    }
  }
  return;
}

Assistant:

void
Image::removeMask(void)
{
	if(this->depth <= 8){
		assert(this->palette);
		int32 pallen = 4*(1 << this->depth);
		for(int32 i = 0; i < pallen; i += 4)
			this->palette[i+3] = 0xFF;
		return;
	}
	if(this->depth == 24)
		return;
	assert(this->pixels);
	uint8 *line = this->pixels;
	uint8 *p;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		for(int32 x = 0; x < this->width; x++){
			switch(this->depth){
			case 16:
				p[1] |= 0x80;
				p += 2;
				break;
			case 32:
				p[3] = 0xFF;
				p += 4;
				break;
			}
		}
		line += this->stride;
	}
}